

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::MatrixMultiply::backward_impl
          (MatrixMultiply *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  uint uVar1;
  value_type pTVar2;
  const_reference ppTVar3;
  uint *puVar4;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  uint in_R8D;
  int b_1;
  int b;
  int max_b;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffd58;
  DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffd68;
  MatrixBase<Eigen::Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffffd70;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffd78;
  NoAlias<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::MatrixBase>
  *in_stack_fffffffffffffd80;
  Tensor *in_stack_fffffffffffffd88;
  uint in_stack_fffffffffffffd94;
  Tensor *in_stack_fffffffffffffd98;
  int local_1cc;
  int local_38;
  
  if (1 < in_R8D) {
    __assert_fail("i < 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/nodes.cc"
                  ,0x695,
                  "virtual void cnn::MatrixMultiply::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                 );
  }
  ppTVar3 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                      (in_RSI,0);
  pTVar2 = *ppTVar3;
  ppTVar3 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                      (in_RSI,1);
  puVar4 = std::max<unsigned_int>(&(pTVar2->d).bd,&((*ppTVar3)->d).bd);
  uVar1 = *puVar4;
  if (in_R8D == 0) {
    for (local_38 = 0; local_38 < (int)uVar1; local_38 = local_38 + 1) {
      Tensor::batch_matrix(in_stack_fffffffffffffd98,in_stack_fffffffffffffd94);
      std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](in_RSI,1);
      Tensor::batch_matrix(in_stack_fffffffffffffd98,in_stack_fffffffffffffd94);
      Eigen::
      DenseBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
      transpose(in_stack_fffffffffffffd68);
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::
      operator*(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
      Tensor::batch_matrix(in_stack_fffffffffffffd98,in_stack_fffffffffffffd94);
      Eigen::
      MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
      noalias(in_stack_fffffffffffffd58);
      Eigen::
      NoAlias<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>
      ::operator+=(in_stack_fffffffffffffd80,
                   (MatrixBase<Eigen::Product<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>
                    *)in_stack_fffffffffffffd78);
    }
  }
  else {
    ppTVar3 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                        (in_RSI,0);
    if (((*ppTVar3)->d).bd == 1) {
      std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](in_RSI,0);
      Tensor::operator*(in_stack_fffffffffffffd88);
      Eigen::
      DenseBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
      transpose(in_stack_fffffffffffffd68);
      Tensor::colbatch_matrix(in_stack_fffffffffffffd98);
      Eigen::
      MatrixBase<Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>const>>
      ::operator*((MatrixBase<Eigen::Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
                   *)in_stack_fffffffffffffd78,
                  (MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                   *)in_stack_fffffffffffffd70);
      Tensor::colbatch_matrix(in_stack_fffffffffffffd98);
      Eigen::
      MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
      noalias(in_stack_fffffffffffffd58);
      Eigen::
      NoAlias<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>
      ::operator+=(in_stack_fffffffffffffd80,
                   (MatrixBase<Eigen::Product<Eigen::Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                    *)in_stack_fffffffffffffd78);
    }
    else {
      for (local_1cc = 0; local_1cc < (int)uVar1; local_1cc = local_1cc + 1) {
        std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](in_RSI,0)
        ;
        Tensor::batch_matrix(in_stack_fffffffffffffd98,in_stack_fffffffffffffd94);
        Eigen::
        DenseBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
        transpose(in_stack_fffffffffffffd68);
        Tensor::batch_matrix(in_stack_fffffffffffffd98,in_stack_fffffffffffffd94);
        Eigen::
        MatrixBase<Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>const>>
        ::operator*((MatrixBase<Eigen::Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
                     *)in_stack_fffffffffffffd78,
                    (MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                     *)in_stack_fffffffffffffd70);
        Tensor::batch_matrix(in_stack_fffffffffffffd98,in_stack_fffffffffffffd94);
        Eigen::
        MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
        noalias(in_stack_fffffffffffffd58);
        Eigen::
        NoAlias<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>
        ::operator+=(in_stack_fffffffffffffd80,
                     (MatrixBase<Eigen::Product<Eigen::Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                      *)in_stack_fffffffffffffd78);
      }
    }
  }
  return;
}

Assistant:

void MatrixMultiply::backward_impl(const vector<const Tensor*>& xs,
                                const Tensor& fx,
                                const Tensor& dEdf,
                                unsigned i,
                                Tensor& dEdxi) const {
  assert(i < 2);
  int max_b = max(xs[0]->d.bd, xs[1]->d.bd);
#if HAVE_CUDA
  if (i == 0) {
    for(int b = 0; b < max_b; ++b)
      CUBLAS_CHECK(cublasSgemm(cublas_handle, CUBLAS_OP_N, CUBLAS_OP_T,
            dEdxi.d.rows(), dEdxi.d.cols(), dEdf.d.cols(),
            kSCALAR_ONE,
            dEdf.batch_ptr(b), dEdf.d.rows(),
            xs[1]->batch_ptr(b), xs[1]->d.rows(),
            kSCALAR_ONE, dEdxi.batch_ptr(b), dEdxi.d.rows()));
  } else {
    // Do a single multiply if xs[0] has one batch
    if(xs[0]->d.bd == 1) {
      // dEdxi.colbatch_matrix().noalias() += (**xs[0]).transpose() * dEdf.colbatch_matrix();
      CUBLAS_CHECK(cublasSgemm(cublas_handle, CUBLAS_OP_T, CUBLAS_OP_N,
            dEdxi.d.rows(), dEdxi.d.cols()*dEdxi.d.batch_elems(), xs[0]->d.rows(),
            kSCALAR_ONE,
            xs[0]->v, xs[0]->d.rows(),
            dEdf.v, dEdf.d.rows(),
            kSCALAR_ONE, dEdxi.v, dEdxi.d.rows()));
    } else {
      for(int b = 0; b < max_b; ++b)
        CUBLAS_CHECK(cublasSgemm(cublas_handle, CUBLAS_OP_T, CUBLAS_OP_N,
              dEdxi.d.rows(), dEdxi.d.cols(), xs[0]->d.rows(),
              kSCALAR_ONE,
              xs[0]->batch_ptr(b), xs[0]->d.rows(),
              dEdf.batch_ptr(b), dEdf.d.rows(),
              kSCALAR_ONE, dEdxi.batch_ptr(b), dEdxi.d.rows()));
    }
  }
#else
  if (i == 0) {
    for(int b = 0; b < max_b; ++b)
      dEdxi.batch_matrix(b).noalias() += dEdf.batch_matrix(b) * xs[1]->batch_matrix(b).transpose();
  } else {
    if(xs[0]->d.bd == 1) {
      dEdxi.colbatch_matrix().noalias() += (**xs[0]).transpose() * dEdf.colbatch_matrix();
    } else {
      for(int b = 0; b < max_b; ++b)
        dEdxi.batch_matrix(b).noalias() += xs[0]->batch_matrix(b).transpose() * dEdf.batch_matrix(b);
    }
  }
#endif
}